

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O2

bool __thiscall
MipsElfRelocator::processHi16Entries
          (MipsElfRelocator *this,uint32_t lo16Opcode,int64_t lo16RelocationBase,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  pointer pHVar1;
  uint uVar2;
  bool bVar3;
  pointer pHVar4;
  uint32_t opcode;
  string local_50;
  
  pHVar1 = (this->hi16Entries).
           super__Vector_base<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (pHVar4 = (this->hi16Entries).
                super__Vector_base<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>
                ._M_impl.super__Vector_impl_data._M_start; pHVar4 != pHVar1; pHVar4 = pHVar4 + 1) {
    if (pHVar4->relocationBase == lo16RelocationBase) {
      uVar2 = pHVar4->opcode * 0x10000 + (int)(short)lo16Opcode + (int)lo16RelocationBase;
      local_50._M_dataplus._M_p._0_4_ =
           (uVar2 >> 0x10) + (uint)((uVar2 >> 0xf & 1) != 0) & 0xffff | pHVar4->opcode & 0xffff0000;
      std::vector<RelocationAction,std::allocator<RelocationAction>>::
      emplace_back<long_const&,unsigned_int&>
                ((vector<RelocationAction,std::allocator<RelocationAction>> *)actions,
                 &pHVar4->offset,(uint *)&local_50);
    }
    else {
      tinyformat::format<>
                (&local_50,"Mismatched R_MIPS_HI16 with R_MIPS_LO16 of a different symbol");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = false;
    }
  }
  pHVar4 = (this->hi16Entries).
           super__Vector_base<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->hi16Entries).
      super__Vector_base<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar4) {
    (this->hi16Entries).
    super__Vector_base<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar4;
  }
  return bVar3;
}

Assistant:

bool MipsElfRelocator::processHi16Entries(uint32_t lo16Opcode, int64_t lo16RelocationBase, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	bool result = true;

	for (const Hi16Entry &hi16: hi16Entries)
	{
		if (hi16.relocationBase != lo16RelocationBase)
		{
			errors.push_back(tfm::format("Mismatched R_MIPS_HI16 with R_MIPS_LO16 of a different symbol"));
			result = false;
			continue;
		}

		int32_t addend = (int32_t)((hi16.opcode & 0xFFFF) << 16) + (int16_t)(lo16Opcode & 0xFFFF);
		int64_t fullPosition = addend + hi16.relocationBase;
		uint32_t opcode = (hi16.opcode & 0xffff0000) | (((fullPosition >> 16) + ((fullPosition & 0x8000) != 0)) & 0xFFFF);
		actions.emplace_back(hi16.offset, opcode);
	}

	hi16Entries.clear();
	return result;
}